

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall
testing::Matcher<const_wchar_t_*>::Matcher(Matcher<const_wchar_t_*> *this,wchar_t *value)

{
  linked_ptr<const_testing::MatcherInterface<const_wchar_t_*>_> local_30;
  
  (this->super_MatcherBase<const_wchar_t_*>).impl_.value_ = (MatcherInterface<const_wchar_t_*> *)0x0
  ;
  (this->super_MatcherBase<const_wchar_t_*>).impl_.link_.next_ =
       &(this->super_MatcherBase<const_wchar_t_*>).impl_.link_;
  (this->super_MatcherBase<const_wchar_t_*>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001d9c88;
  local_30.value_ = (MatcherInterface<const_wchar_t_*> *)operator_new(0x10);
  ((local_30.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001d9e48;
  local_30.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)value;
  local_30.link_.next_ = &local_30.link_;
  internal::linked_ptr<const_testing::MatcherInterface<const_wchar_t_*>_>::operator=
            (&(this->super_MatcherBase<const_wchar_t_*>).impl_,&local_30);
  internal::linked_ptr<const_testing::MatcherInterface<const_wchar_t_*>_>::~linked_ptr(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }